

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O3

string * __thiscall
upb::generator::(anonymous_namespace)::ToCIdent_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,string_view str)

{
  string *psVar1;
  undefined8 local_60;
  char *local_58;
  undefined8 local_50;
  char *local_48;
  undefined8 local_40;
  char *local_38;
  undefined8 local_30;
  char *local_28;
  undefined8 local_20;
  char *local_18;
  undefined8 local_10;
  char *local_8;
  
  local_60 = 1;
  local_58 = ".";
  local_50 = 1;
  local_48 = "_";
  local_40 = 1;
  local_38 = "/";
  local_30 = 1;
  local_28 = "_";
  local_20 = 1;
  local_18 = "-";
  local_10 = 1;
  local_8 = "_";
  psVar1 = (string *)
           absl::lts_20240722::StrReplaceAll_abi_cxx11_
                     (__return_storage_ptr__,this,str._M_len,&local_60,3);
  return psVar1;
}

Assistant:

std::string ToCIdent(absl::string_view str) {
  return absl::StrReplaceAll(str, {{".", "_"}, {"/", "_"}, {"-", "_"}});
}